

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O0

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  double dVar1;
  double local_240;
  double value;
  GLFWgammaramp ramp;
  unsigned_short values [256];
  int i;
  float gamma_local;
  GLFWmonitor *handle_local;
  
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (0.0 < gamma) {
    values[0xfc] = 0;
    values[0xfd] = 0;
    for (; (int)values._504_4_ < 0x100; values._504_4_ = values._504_4_ + 1) {
      dVar1 = pow((double)(int)values._504_4_ / 255.0,1.0 / (double)gamma);
      local_240 = dVar1 * 65535.0 + 0.5;
      if (65535.0 < local_240) {
        local_240 = 65535.0;
      }
      values[(long)(int)values._504_4_ + -4] = (unsigned_short)(int)local_240;
    }
    value = (double)&ramp.size;
    ramp.red = (unsigned_short *)&ramp.size;
    ramp.green = (unsigned_short *)&ramp.size;
    ramp.blue._0_4_ = 0x100;
    glfwSetGammaRamp(handle,(GLFWgammaramp *)&value);
  }
  else {
    _glfwInputError(0x10004,"Gamma value must be greater than zero");
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    int i;
    unsigned short values[256];
    GLFWgammaramp ramp;

    _GLFW_REQUIRE_INIT();

    if (gamma <= 0.f)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Gamma value must be greater than zero");
        return;
    }

    for (i = 0;  i < 256;  i++)
    {
        double value;

        // Calculate intensity
        value = i / 255.0;
        // Apply gamma curve
        value = pow(value, 1.0 / gamma) * 65535.0 + 0.5;

        // Clamp to value range
        if (value > 65535.0)
            value = 65535.0;

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = 256;

    glfwSetGammaRamp(handle, &ramp);
}